

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runxmlconf.c
# Opt level: O2

int main(int argc,char **argv)

{
  xmlNodePtr cur;
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 *puVar4;
  xmlDocPtr doc;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  _xmlNode **pp_Var10;
  
  logfile = (FILE *)fopen64("runxmlconf.log","w");
  if ((FILE *)logfile == (FILE *)0x0) {
    fwrite("Could not open the log file, running in verbose mode\n",0x35,1,_stderr);
    verbose = 1;
  }
  puVar4 = (undefined4 *)__xmlGetWarningsDefaultValue();
  *puVar4 = 0;
  xmlPedanticParserDefault(0);
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  xmlInitParser();
  xmlSetExternalEntityLoader(testExternalEntityLoader);
  ctxtXPath = (xmlXPathContextPtr_conflict)xmlXPathNewContext(0);
  if (ctxtXPath->cache != (void *)0x0) {
    xmlXPathContextSetCache(ctxtXPath,0,0xffffffffffffffff,0);
  }
  xmlSetStructuredErrorFunc(0,testErrorHandler);
  iVar2 = nb_leaks;
  iVar1 = nb_tests;
  iVar7 = nb_errors;
  if ((((1 < argc) && (pcVar9 = argv[1], *pcVar9 == '-')) && (pcVar9[1] == 'v')) &&
     (pcVar9[2] == '\0')) {
    verbose = 1;
  }
  iVar3 = checkTestFile("xmlconf/xmlconf.xml");
  if (iVar3 == 0) {
    pcVar9 = "%s is missing \n";
LAB_001026e7:
    fprintf(_stderr,pcVar9,"xmlconf/xmlconf.xml");
    xmlconfInfo();
  }
  else {
    doc = (xmlDocPtr)xmlReadFile("xmlconf/xmlconf.xml",0,2);
    if (doc == (xmlDocPtr)0x0) {
      pcVar9 = "%s is corrupted \n";
      goto LAB_001026e7;
    }
    lVar5 = xmlDocGetRootElement(doc);
    if (lVar5 == 0) {
LAB_0010257d:
      fprintf(_stderr,"Unexpected format %s\n","xmlconf/xmlconf.xml");
      xmlconfInfo();
    }
    else {
      iVar3 = xmlStrEqual(*(undefined8 *)(lVar5 + 0x10),"TESTSUITE");
      if (iVar3 == 0) goto LAB_0010257d;
      lVar6 = xmlGetProp(lVar5,"PROFILE");
      if (lVar6 == 0) {
        puts("Test suite");
      }
      else {
        printf("Test suite: %s\n",lVar6);
        (*_xmlFree)(lVar6);
      }
      pp_Var10 = (_xmlNode **)(lVar5 + 0x18);
      while (cur = *pp_Var10, cur != (xmlNodePtr)0x0) {
        if (cur->type == XML_ELEMENT_NODE) {
          iVar3 = xmlStrEqual(cur->name,"TESTCASES");
          if (iVar3 == 0) {
            fprintf(_stderr,"Unhandled element %s\n",cur->name);
          }
          else {
            xmlconfTestCases(doc,cur,1);
          }
        }
        pp_Var10 = &cur->next;
      }
    }
    xmlFreeDoc(doc);
  }
  if (nb_leaks == iVar2 && nb_errors == iVar7) {
    printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar1));
  }
  else {
    printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar1),
           (ulong)(uint)(nb_errors - iVar7),(ulong)(uint)(nb_leaks - iVar2));
  }
  uVar8 = (ulong)(uint)nb_tests;
  if (nb_errors == 0 && nb_leaks == 0) {
    pcVar9 = "Total %d tests, no errors\n";
  }
  else {
    iVar7 = 1;
    printf("Total %d tests, %d errors, %d leaks\n",uVar8);
    printf("See %s for detailed output\n","runxmlconf.log");
    if ((nb_leaks != 0) || (nb_errors != 0xf)) goto LAB_00102663;
    pcVar9 = "%d errors were expected\n";
    uVar8 = 0xf;
  }
  iVar7 = 0;
  printf(pcVar9,uVar8);
LAB_00102663:
  xmlXPathFreeContext(ctxtXPath);
  xmlCleanupParser();
  xmlMemoryDump();
  if (logfile != (FILE *)0x0) {
    fclose((FILE *)logfile);
  }
  return iVar7;
}

Assistant:

int
main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    int ret = 0;
    int old_errors, old_tests, old_leaks;

    logfile = fopen(LOGFILE, "w");
    if (logfile == NULL) {
        fprintf(stderr,
	        "Could not open the log file, running in verbose mode\n");
	verbose = 1;
    }
    initializeLibxml2();

    if ((argc >= 2) && (!strcmp(argv[1], "-v")))
        verbose = 1;


    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    xmlconfTest();
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests, no errors\n", nb_tests - old_tests);
    else
	printf("Ran %d tests, %d errors, %d leaks\n",
	       nb_tests - old_tests,
	       nb_errors - old_errors,
	       nb_leaks - old_leaks);
    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
	ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
	printf("See %s for detailed output\n", LOGFILE);
	if ((nb_leaks == 0) && (nb_errors == NB_EXPECTED_ERRORS)) {
	    printf("%d errors were expected\n", nb_errors);
	    ret = 0;
	}
    }
    xmlXPathFreeContext(ctxtXPath);
    xmlCleanupParser();
    xmlMemoryDump();

    if (logfile != NULL)
        fclose(logfile);
    return(ret);
}